

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

int tclpkcs11_importcert(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_char_ptr_uint *p_Var1;
  Tcl_Obj *pTVar2;
  tclpkcs11_handle *handle;
  int iVar3;
  int iVar4;
  uchar *outbuf;
  unsigned_long buflen;
  Tcl_Obj *pTVar5;
  char *pcVar6;
  size_t sVar7;
  CK_SLOT_ID slot;
  CK_BYTE_PTR pCVar8;
  ProcErrorProc *pPVar9;
  CK_RV CVar10;
  long lVar11;
  CK_ULONG foundObjs;
  int tcl_keylist_llength;
  CK_OBJECT_HANDLE hObject;
  CK_ATTRIBUTE attr_update [1];
  Tcl_Obj **tcl_keylist_values;
  CK_OBJECT_HANDLE pub_key;
  CK_ATTRIBUTE template [2];
  CK_MECHANISM mechanism_desc_sha1;
  CK_ULONG resultbuf_len;
  long serial_num;
  x509_object x509;
  CK_ULONG local_3e0;
  uint local_3d4;
  CK_OBJECT_HANDLE local_3d0;
  Tcl_Obj *local_3c8;
  Tcl_Obj *local_3c0;
  CK_ATTRIBUTE local_3b8;
  ClientData local_3a0;
  Tcl_Obj **local_398;
  CK_OBJECT_HANDLE local_390;
  CK_ATTRIBUTE local_388;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 uStack_360;
  CK_ATTRIBUTE local_358;
  undefined8 local_340;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  CK_BYTE_PTR local_320;
  unsigned_long uStack_318;
  undefined8 local_310;
  undefined1 *local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  undefined8 local_2c8;
  void *local_2c0;
  unsigned_long uStack_2b8;
  undefined8 local_2b0;
  void *local_2a8;
  unsigned_long uStack_2a0;
  undefined8 local_298;
  uchar *local_290;
  unsigned_long uStack_288;
  undefined8 local_280;
  CK_ULONG *local_278;
  unsigned_long local_270;
  CK_MECHANISM local_268;
  CK_ULONG local_248 [2];
  x509_object local_238;
  
  local_390 = 0;
  local_278 = local_248 + 1;
  local_248[1] = 0;
  local_268.ulParameterLen = 0;
  local_268.mechanism = 0x220;
  local_268.pParameter = (CK_VOID_PTR)0x0;
  local_358.type = 0;
  local_358.pValue = &tclpkcs11_perform_pki_importcert_oclass_cert;
  local_358.ulValueLen = 8;
  local_340 = 0x80;
  local_338 = &tclpkcs11_perform_pki_importcert_ocert_type;
  local_330 = 8;
  local_328 = 0x102;
  local_320 = (CK_BYTE_PTR)0x0;
  uStack_318 = 0;
  local_310 = 1;
  local_308 = &tclpkcs11_perform_pki_importcert_ltrue;
  local_300 = 1;
  local_2f8 = 2;
  local_2f0 = &tclpkcs11_perform_pki_importcert_lfalse;
  local_2e8 = 1;
  local_2e0 = 3;
  local_2d8 = (char *)0x0;
  sStack_2d0 = 0;
  local_2c8 = 0x101;
  local_2c0 = (void *)0x0;
  uStack_2b8 = 0;
  local_2b0 = 0x81;
  local_2a8 = (void *)0x0;
  uStack_2a0 = 0;
  local_298 = 0x11;
  local_290 = (uchar *)0x0;
  uStack_288 = 0;
  local_280 = 0x82;
  local_270 = 8;
  local_388.pValue = (CK_BYTE_PTR)0x0;
  local_368 = (undefined8 *)0x0;
  uStack_360 = 0;
  local_388.ulValueLen = 0;
  uStack_370 = 0;
  local_388.type = 0x102;
  local_3b8.ulValueLen = 0;
  local_3b8.type = 3;
  local_3b8.pValue = (char *)0x0;
  if (objc == 3) {
    pTVar5 = objv[1];
    p_Var1 = tclStubsPtr->tcl_Alloc;
    local_3a0 = cd;
    iVar3 = (*tclStubsPtr->tcl_GetCharLength)(pTVar5);
    outbuf = (uchar *)(*p_Var1)(iVar3 / 2);
    iVar3 = (*tclStubsPtr->tcl_GetCharLength)(pTVar5);
    buflen = tclpkcs11_string_to_bytearray(pTVar5,outbuf,(long)(iVar3 / 2));
    iVar3 = asn1_x509_read_object(outbuf,buflen,&local_238);
    if (iVar3 == -1) {
      pPVar9 = tclStubsPtr->tcl_SetObjResult;
      pcVar6 = "bad certificate";
    }
    else {
      local_2c0 = local_238.subject.asn1rep;
      uStack_2b8 = local_238.subject.asn1rep_len;
      local_2a8 = local_238.issuer.asn1rep;
      uStack_2a0 = local_238.issuer.asn1rep_len;
      local_278 = (CK_ULONG *)local_238.serial_number.asn1rep;
      local_270 = local_238.serial_number.asn1rep_len;
      pTVar5 = objv[2];
      local_290 = outbuf;
      uStack_288 = buflen;
      if (1 < pTVar5->refCount) {
        pTVar5 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar5);
      }
      iVar3 = (*tclStubsPtr->tcl_ListObjGetElements)
                        ((Tcl_Interp_conflict *)interp,pTVar5,(int *)&local_3d4,&local_398);
      if (iVar3 != 0) {
        return iVar3;
      }
      if ((local_3d4 & 1) == 0) {
        if (0 < (int)local_3d4) {
          lVar11 = 0;
          iVar3 = 0;
          local_3c0 = (Tcl_Obj *)0x0;
          local_3c8 = (Tcl_Obj *)0x0;
          do {
            pTVar5 = local_398[lVar11];
            pTVar2 = local_398[lVar11 + 1];
            pcVar6 = (*tclStubsPtr->tcl_GetString)(pTVar5);
            iVar4 = strcmp(pcVar6,"pkcs11_handle");
            if (iVar4 == 0) {
              iVar3 = iVar3 + 1;
              local_3c0 = pTVar2;
            }
            else {
              pcVar6 = (*tclStubsPtr->tcl_GetString)(pTVar5);
              iVar4 = strcmp(pcVar6,"pkcs11_slotid");
              if (iVar4 == 0) {
                iVar3 = iVar3 + 1;
                local_3c8 = pTVar2;
              }
              else {
                pcVar6 = (*tclStubsPtr->tcl_GetString)(pTVar5);
                iVar4 = strcmp(pcVar6,"pkcs11_label");
                if (iVar4 == 0) {
                  local_2d8 = (*tclStubsPtr->tcl_GetString)(pTVar2);
                  pcVar6 = (*tclStubsPtr->tcl_GetString)(pTVar2);
                  sVar7 = strlen(pcVar6);
                  sStack_2d0 = sVar7;
                  local_3b8.pValue = (*tclStubsPtr->tcl_GetString)(pTVar2);
                  iVar3 = iVar3 + 1;
                  local_3b8.ulValueLen = sVar7;
                }
              }
            }
            lVar11 = lVar11 + 2;
          } while ((int)lVar11 < (int)local_3d4);
          if (iVar3 == 3) {
            lVar11 = (**(code **)((long)local_3a0 + 0x40))(local_3a0,local_3c0);
            if ((lVar11 == 0) ||
               (handle = *(tclpkcs11_handle **)(lVar11 + 0x18), handle == (tclpkcs11_handle *)0x0))
            {
              pPVar9 = tclStubsPtr->tcl_SetObjResult;
              pcVar6 = "invalid handle";
              goto LAB_00107b4a;
            }
            pcVar6 = (*tclStubsPtr->tcl_GetString)(local_3c8);
            slot = atol(pcVar6);
            iVar3 = tclpkcs11_start_session(handle,slot);
            if (iVar3 == 0) {
              pCVar8 = (CK_BYTE_PTR)(*tclStubsPtr->tcl_Alloc)(0x14);
              local_388.ulValueLen = 0x14;
              local_388.pValue = pCVar8;
              CVar10 = (*handle->pkcs11->C_DigestInit)(handle->session,&local_268);
              if (CVar10 == 0) {
                local_248[0] = 0x14;
                CVar10 = (*handle->pkcs11->C_Digest)
                                   (handle->session,
                                    (CK_BYTE_PTR)((long)local_238.pubkey.contents + 1),
                                    local_238.pubkey.size - 1,pCVar8,local_248);
                if (CVar10 == 0) {
                  uStack_318 = 0x14;
                  local_368 = &tclpkcs11_perform_pki_importcert_oclass_cert;
                  uStack_360 = 8;
                  local_320 = pCVar8;
                  CVar10 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_388,2);
                  if (CVar10 == 0) {
                    CVar10 = (*handle->pkcs11->C_FindObjects)
                                       (handle->session,&local_3d0,1,&local_3e0);
                    if (CVar10 != 0) {
                      pPVar9 = tclStubsPtr->tcl_SetObjResult;
                      pTVar5 = tclpkcs11_pkcs11_error(CVar10);
                      goto LAB_00107c78;
                    }
                    (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                    if (local_3e0 == 0) {
                      CVar10 = (*handle->pkcs11->C_CreateObject)
                                         (handle->session,&local_358,10,&local_390);
                      if (CVar10 == 0) {
                        local_368 = &tclpkcs11_perform_pki_importcert_oclass_pub;
                        uStack_360 = 8;
                        CVar10 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_388,2);
                        if (CVar10 == 0) {
                          CVar10 = (*handle->pkcs11->C_FindObjects)
                                             (handle->session,&local_3d0,1,&local_3e0);
                          if (CVar10 == 0) {
                            (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                            if (local_3e0 == 1) {
                              (*handle->pkcs11->C_SetAttributeValue)
                                        (handle->session,local_3d0,&local_3b8,1);
                            }
                            local_368 = &tclpkcs11_perform_pki_importcert_oclass_priv;
                            uStack_360 = 8;
                            CVar10 = (*handle->pkcs11->C_FindObjectsInit)
                                               (handle->session,&local_388,2);
                            if (CVar10 != 0) goto LAB_00107d3b;
                            CVar10 = (*handle->pkcs11->C_FindObjects)
                                               (handle->session,&local_3d0,1,&local_3e0);
                            if (CVar10 == 0) {
                              (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                              if (local_3e0 == 1) {
                                (*handle->pkcs11->C_SetAttributeValue)
                                          (handle->session,local_3d0,&local_3b8,1);
                              }
                              pTVar5 = tclpkcs11_bytearray_to_string(local_320,uStack_318);
                              (*tclStubsPtr->tcl_Free)((char *)local_320);
                              (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar5)
                              ;
                              return 0;
                            }
                          }
                          pPVar9 = tclStubsPtr->tcl_SetObjResult;
                          pTVar5 = tclpkcs11_pkcs11_error(CVar10);
LAB_00107c78:
                          (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar5);
                          (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                          return 1;
                        }
LAB_00107d3b:
                        pPVar9 = tclStubsPtr->tcl_SetObjResult;
                        pTVar5 = tclpkcs11_pkcs11_error(CVar10);
                        goto LAB_00107b58;
                      }
                      if (CVar10 == 0x101) {
                        pPVar9 = tclStubsPtr->tcl_SetObjResult;
                        pcVar6 = "importcert: cannot create object for certificate, not logged";
                      }
                      else {
                        pPVar9 = tclStubsPtr->tcl_SetObjResult;
                        pcVar6 = "importcert: cannot create object for certificate";
                      }
                    }
                    else {
                      pPVar9 = tclStubsPtr->tcl_SetObjResult;
                      pcVar6 = "Certificate with the CKA_ID exist";
                    }
                    pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(pcVar6,-1);
                    goto LAB_00107b58;
                  }
                }
              }
              pPVar9 = tclStubsPtr->tcl_SetObjResult;
            }
            else {
              CVar10 = (CK_RV)iVar3;
              pPVar9 = tclStubsPtr->tcl_SetObjResult;
            }
            pTVar5 = tclpkcs11_pkcs11_error(CVar10);
            goto LAB_00107b58;
          }
        }
        pPVar9 = tclStubsPtr->tcl_SetObjResult;
        pcVar6 = "invalid  handle or slot or param";
      }
      else {
        pPVar9 = tclStubsPtr->tcl_SetObjResult;
        pcVar6 = "list must have an even number of elements";
      }
    }
  }
  else {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "wrong # args: should be \"pki::pkcs11::importcert cert_der_hex list_token_and_cka\"";
  }
LAB_00107b4a:
  pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(pcVar6,-1);
LAB_00107b58:
  (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar5);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_importcert(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "ImportCert START\n");
  return(tclpkcs11_perform_pki_importcert(cd, interp, objc, objv));
}